

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int parse_int(int *out,char **str)

{
  int i;
  char **str_local;
  int *out_local;
  int local_4;
  
  *out = 0;
  if ((**str < '0') || ('9' < **str)) {
    local_4 = -1;
  }
  else {
    i = **str + -0x30;
    *str = *str + 1;
    while (('/' < **str && (**str < ':'))) {
      i = i * 10 + **str + -0x30;
      *str = *str + 1;
    }
    *out = i;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int parse_int(int *out, const char **str)
{
	int i = 0;
	*out = 0;
	if(**str < '0' || **str > '9')
		return -1;

	i = **str - '0';
	(*str)++;

	while(1)
	{
		if(**str < '0' || **str > '9')
		{
			*out = i;
			return 0;
		}

		i = (i*10) + (**str - '0');
		(*str)++;
	}

	return 0;
}